

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d_x86.cpp
# Opt level: O3

int __thiscall ncnn::Convolution1D_x86::create_pipeline(Convolution1D_x86 *this,Option *opt)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  void *pvVar4;
  size_t sVar5;
  size_t sVar6;
  int *piVar7;
  Allocator *pAVar8;
  bool bVar9;
  int k;
  uint uVar10;
  uint uVar11;
  long lVar12;
  void *pvVar13;
  int k_1;
  int iVar14;
  int iVar15;
  void *pvVar16;
  long lVar17;
  long lVar18;
  uint uVar19;
  long lVar20;
  void *pvVar21;
  ulong uVar22;
  long lVar23;
  undefined4 *puVar24;
  bool bVar25;
  int iVar26;
  long lVar27;
  ulong uVar28;
  undefined4 *puVar29;
  int iVar30;
  uint _w;
  void *pvVar31;
  undefined4 *puVar32;
  long lVar33;
  int iVar34;
  long lVar35;
  ulong uVar36;
  undefined4 *puVar37;
  void *pvVar38;
  void *pvVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  long lVar43;
  void *pvVar44;
  void *pvVar45;
  long lVar46;
  ulong uVar47;
  uint local_a8;
  
  if ((this->super_Convolution1D).dynamic_weight != 0) {
    return 0;
  }
  uVar1 = (this->super_Convolution1D).kernel_w;
  lVar27 = (long)(int)uVar1;
  uVar47 = (ulong)uVar1;
  uVar28 = (long)(this->super_Convolution1D).weight_data_size / (long)(int)uVar1;
  uVar2 = (this->super_Convolution1D).num_output;
  uVar28 = (long)((ulong)(uint)((int)uVar28 >> 0x1f) << 0x20 | uVar28 & 0xffffffff) /
           (long)(int)uVar2;
  uVar10 = (uint)uVar28;
  if ((long)(int)uVar2 < 4) {
    uVar19 = uVar10;
    if ((int)uVar2 < 2) {
      uVar11 = uVar2;
      if ((int)uVar10 < 4) {
        _w = uVar1;
        if (1 < (int)uVar10) {
          uVar19 = (uVar10 & 1) + 1;
          _w = uVar1 * 2;
        }
      }
      else {
        uVar19 = (uVar10 & 1) + ((uint)(uVar28 >> 2) & 0x3fffffff) + (uint)((uVar10 >> 1 & 1) != 0);
        _w = uVar1 * 4;
      }
    }
    else {
      if ((int)uVar10 < 4) {
        if ((int)uVar10 < 2) {
          uVar11 = (uVar2 & 1) + 1;
          _w = uVar1 * 2;
          goto LAB_0052977e;
        }
        _w = uVar1 * 4;
        uVar19 = (uVar10 & 1) + 1;
      }
      else {
        uVar19 = (uVar10 & 1) + ((uint)(uVar28 >> 2) & 0x3fffffff) + (uint)((uVar10 >> 1 & 1) != 0);
        _w = uVar1 * 8;
      }
      uVar11 = (uVar2 & 1) + 1;
    }
LAB_0052977e:
    Mat::create(&this->weight_data_tm,_w,uVar19,uVar11,4,(Allocator *)0x0);
    uVar28 = 0;
    goto LAB_0052978d;
  }
  if ((int)uVar10 < 4) {
    if (1 < (int)uVar10) {
      iVar30 = uVar1 * 8;
      uVar19 = (uVar10 & 1) + 1;
      goto LAB_0052937b;
    }
    iVar30 = uVar1 * 4;
    iVar14 = (uVar2 & 1) + (uVar2 >> 2) + (uint)((uVar2 >> 1 & 1) != 0);
    uVar19 = uVar10;
  }
  else {
    iVar30 = uVar1 << 4;
    uVar19 = (uVar10 & 1) + ((uint)(uVar28 >> 2) & 0x3fffffff) + (uint)((uVar10 >> 1 & 1) != 0);
LAB_0052937b:
    iVar14 = (uVar2 & 1) + (uVar2 >> 2) + (uint)((uVar2 >> 1 & 1) != 0);
  }
  Mat::create(&this->weight_data_tm,iVar30,uVar19,iVar14,4,(Allocator *)0x0);
  pvVar3 = (this->super_Convolution1D).weight_data.data;
  pvVar4 = (this->weight_data_tm).data;
  iVar15 = uVar10 * uVar1;
  sVar5 = (this->weight_data_tm).elemsize;
  sVar6 = (this->weight_data_tm).cstep;
  iVar34 = uVar1 * uVar10;
  iVar14 = iVar34 * 3;
  iVar30 = iVar34 * 4;
  lVar20 = (long)(int)(uVar1 * 4) * 4;
  iVar34 = iVar34 * 2;
  lVar12 = (long)(int)(uVar1 * 2) * 4;
  iVar26 = 0;
  uVar36 = 0;
  iVar42 = iVar15;
  do {
    puVar32 = (undefined4 *)((uVar36 >> 2) * sVar5 * sVar6 + (long)pvVar4);
    if ((int)uVar10 < 4) {
      uVar19 = (uint)uVar36;
      pvVar31 = (void *)((long)pvVar3 + (long)(int)(iVar15 * uVar19) * 4);
      pvVar38 = (void *)((long)pvVar3 + (long)(int)((uVar19 | 1) * iVar15) * 4);
      pvVar21 = (void *)((long)pvVar3 + (long)(int)((uVar19 | 2) * iVar15) * 4);
      pvVar39 = (void *)((long)pvVar3 + (long)(int)((uVar19 | 3) * iVar15) * 4);
      uVar19 = 0;
    }
    else {
      pvVar39 = (void *)((long)pvVar3 + (long)iVar14 * 4);
      pvVar21 = (void *)((long)pvVar3 + (long)iVar34 * 4);
      pvVar38 = (void *)((long)pvVar3 + (long)iVar42 * 4);
      pvVar31 = (void *)((long)pvVar3 + (long)iVar26 * 4);
      iVar40 = 0;
      do {
        if (0 < (int)uVar1) {
          uVar28 = 0;
          pvVar13 = pvVar31;
          pvVar16 = pvVar38;
          pvVar44 = pvVar39;
          pvVar45 = pvVar21;
          do {
            puVar37 = puVar32;
            lVar33 = 0;
            lVar35 = 0;
            do {
              *(undefined4 *)((long)puVar37 + lVar35) = *(undefined4 *)((long)pvVar13 + lVar33);
              *(undefined4 *)((long)puVar37 + lVar35 + 4) = *(undefined4 *)((long)pvVar16 + lVar33);
              *(undefined4 *)((long)puVar37 + lVar35 + 8) = *(undefined4 *)((long)pvVar45 + lVar33);
              *(undefined4 *)((long)puVar37 + lVar35 + 0xc) =
                   *(undefined4 *)((long)pvVar44 + lVar33);
              lVar35 = lVar35 + 0x10;
              lVar33 = lVar33 + lVar27 * 4;
            } while ((int)lVar35 != 0x40);
            uVar28 = uVar28 + 1;
            pvVar44 = (void *)((long)pvVar44 + 4);
            pvVar45 = (void *)((long)pvVar45 + 4);
            pvVar16 = (void *)((long)pvVar16 + 4);
            pvVar13 = (void *)((long)pvVar13 + 4);
            puVar32 = (undefined4 *)((long)puVar37 + lVar35);
          } while (uVar28 != uVar47);
          puVar32 = (undefined4 *)((long)puVar37 + lVar35);
        }
        pvVar31 = (void *)((long)pvVar31 + lVar20);
        pvVar38 = (void *)((long)pvVar38 + lVar20);
        pvVar21 = (void *)((long)pvVar21 + lVar20);
        pvVar39 = (void *)((long)pvVar39 + lVar20);
        iVar41 = iVar40 + 7;
        iVar40 = iVar40 + 4;
        uVar19 = uVar10 & 0xfffffffc;
      } while (iVar41 < (int)uVar10);
    }
    uVar11 = uVar19 | 1;
    while ((int)uVar11 < (int)uVar10) {
      if (0 < (int)uVar1) {
        uVar28 = 0;
        pvVar13 = pvVar38;
        pvVar16 = pvVar21;
        pvVar44 = pvVar39;
        pvVar45 = pvVar31;
        do {
          lVar33 = 0;
          bVar9 = true;
          do {
            bVar25 = bVar9;
            *puVar32 = *(undefined4 *)((long)pvVar45 + lVar33);
            puVar32[1] = *(undefined4 *)((long)pvVar13 + lVar33);
            puVar32[2] = *(undefined4 *)((long)pvVar16 + lVar33);
            puVar32[3] = *(undefined4 *)((long)pvVar44 + lVar33);
            puVar32 = puVar32 + 4;
            lVar33 = lVar33 + lVar27 * 4;
            bVar9 = false;
          } while (bVar25);
          uVar28 = uVar28 + 1;
          pvVar44 = (void *)((long)pvVar44 + 4);
          pvVar16 = (void *)((long)pvVar16 + 4);
          pvVar13 = (void *)((long)pvVar13 + 4);
          pvVar45 = (void *)((long)pvVar45 + 4);
        } while (uVar28 != uVar47);
      }
      pvVar31 = (void *)((long)pvVar31 + lVar12);
      pvVar38 = (void *)((long)pvVar38 + lVar12);
      pvVar21 = (void *)((long)pvVar21 + lVar12);
      pvVar39 = (void *)((long)pvVar39 + lVar12);
      uVar11 = uVar19 + 3;
      uVar19 = uVar19 + 2;
    }
    if ((int)uVar19 < (int)uVar10) {
      do {
        if (0 < (int)uVar1) {
          uVar28 = 0;
          do {
            *puVar32 = *(undefined4 *)((long)pvVar31 + uVar28 * 4);
            puVar32[1] = *(undefined4 *)((long)pvVar38 + uVar28 * 4);
            puVar32[2] = *(undefined4 *)((long)pvVar21 + uVar28 * 4);
            puVar32[3] = *(undefined4 *)((long)pvVar39 + uVar28 * 4);
            puVar32 = puVar32 + 4;
            uVar28 = uVar28 + 1;
          } while (uVar47 != uVar28);
        }
        uVar19 = uVar19 + 1;
      } while (uVar19 != uVar10);
    }
    uVar28 = uVar36 + 4;
    uVar22 = uVar36 + 7;
    iVar14 = iVar14 + iVar30;
    iVar34 = iVar34 + iVar30;
    iVar42 = iVar42 + iVar30;
    iVar26 = iVar26 + iVar30;
    uVar36 = uVar28;
  } while (uVar22 < uVar2);
LAB_0052978d:
  uVar11 = (uint)uVar28;
  uVar19 = uVar11 | 1;
  if ((int)uVar19 < (int)uVar2) {
    pvVar3 = (this->super_Convolution1D).weight_data.data;
    pvVar4 = (this->weight_data_tm).data;
    iVar42 = uVar10 * uVar1;
    sVar5 = (this->weight_data_tm).elemsize;
    sVar6 = (this->weight_data_tm).cstep;
    lVar12 = (long)(int)(uVar1 * 2);
    iVar30 = uVar1 * uVar10 * uVar19;
    iVar14 = uVar1 * uVar10 * 2;
    lVar20 = (long)(int)(uVar1 * 4) * 4;
    iVar34 = uVar11 * iVar42;
    uVar28 = uVar28 & 0xffffffff;
    do {
      puVar32 = (undefined4 *)
                ((ulong)(((uint)(uVar28 >> 2) & 0x3fffffff) + (uint)(((uint)uVar28 >> 1 & 1) != 0))
                 * sVar5 * sVar6 + (long)pvVar4);
      if ((int)uVar10 < 4) {
        pvVar31 = (void *)((long)pvVar3 + (long)(int)(iVar42 * (uint)uVar28) * 4);
        pvVar38 = (void *)((long)pvVar3 + (long)(int)(uVar19 * iVar42) * 4);
        uVar19 = 0;
      }
      else {
        lVar17 = (long)iVar30;
        lVar33 = (long)pvVar3 + lVar17 * 4 + (long)(int)(uVar1 * 3) * 4;
        lVar35 = (long)pvVar3 + lVar17 * 4 + lVar12 * 4;
        lVar43 = (long)pvVar3 + lVar17 * 4 + lVar27 * 4;
        pvVar38 = (void *)((long)pvVar3 + lVar17 * 4);
        lVar23 = (long)iVar34;
        lVar17 = (long)pvVar3 + lVar23 * 4 + (long)(int)(uVar1 * 3) * 4;
        lVar18 = (long)pvVar3 + lVar23 * 4 + lVar12 * 4;
        lVar46 = (long)pvVar3 + lVar23 * 4 + lVar27 * 4;
        pvVar31 = (void *)((long)pvVar3 + lVar23 * 4);
        iVar15 = 0;
        do {
          if (0 < (int)uVar1) {
            lVar23 = 0;
            puVar37 = puVar32;
            do {
              puVar29 = puVar37;
              puVar37 = puVar32 + lVar23 * 2;
              *puVar37 = *(undefined4 *)((long)pvVar31 + lVar23);
              puVar37[1] = *(undefined4 *)(lVar46 + lVar23);
              puVar37[2] = *(undefined4 *)(lVar18 + lVar23);
              puVar37[3] = *(undefined4 *)(lVar17 + lVar23);
              puVar37[4] = *(undefined4 *)((long)pvVar38 + lVar23);
              puVar37[5] = *(undefined4 *)(lVar43 + lVar23);
              puVar37[6] = *(undefined4 *)(lVar35 + lVar23);
              puVar37[7] = *(undefined4 *)(lVar33 + lVar23);
              lVar23 = lVar23 + 4;
              puVar37 = puVar37 + 8;
            } while (uVar47 * 4 != lVar23);
            puVar32 = puVar29 + 8;
          }
          pvVar31 = (void *)((long)pvVar31 + lVar20);
          pvVar38 = (void *)((long)pvVar38 + lVar20);
          iVar26 = iVar15 + 7;
          lVar33 = lVar33 + lVar20;
          lVar35 = lVar35 + lVar20;
          lVar43 = lVar43 + lVar20;
          lVar17 = lVar17 + lVar20;
          lVar18 = lVar18 + lVar20;
          lVar46 = lVar46 + lVar20;
          uVar19 = uVar10 & 0xfffffffc;
          iVar15 = iVar15 + 4;
        } while (iVar26 < (int)uVar10);
      }
      uVar11 = uVar19 | 1;
      while ((int)uVar11 < (int)uVar10) {
        if (0 < (int)uVar1) {
          uVar36 = 0;
          pvVar21 = pvVar31;
          pvVar39 = pvVar38;
          do {
            lVar33 = 0;
            bVar9 = true;
            do {
              bVar25 = bVar9;
              *puVar32 = *(undefined4 *)((long)pvVar21 + lVar33);
              puVar32[1] = *(undefined4 *)((long)pvVar39 + lVar33);
              puVar32 = puVar32 + 2;
              lVar33 = lVar33 + lVar27 * 4;
              bVar9 = false;
            } while (bVar25);
            uVar36 = uVar36 + 1;
            pvVar39 = (void *)((long)pvVar39 + 4);
            pvVar21 = (void *)((long)pvVar21 + 4);
          } while (uVar36 != uVar47);
        }
        pvVar31 = (void *)((long)pvVar31 + lVar12 * 4);
        pvVar38 = (void *)((long)pvVar38 + lVar12 * 4);
        uVar11 = uVar19 + 3;
        uVar19 = uVar19 + 2;
      }
      if ((int)uVar19 < (int)uVar10) {
        do {
          if (0 < (int)uVar1) {
            uVar36 = 0;
            do {
              *puVar32 = *(undefined4 *)((long)pvVar31 + uVar36 * 4);
              puVar32[1] = *(undefined4 *)((long)pvVar38 + uVar36 * 4);
              puVar32 = puVar32 + 2;
              uVar36 = uVar36 + 1;
            } while (uVar47 != uVar36);
          }
          uVar19 = uVar19 + 1;
        } while (uVar19 != uVar10);
      }
      uVar36 = uVar28 + 2;
      lVar33 = uVar28 + 3;
      uVar19 = (uint)lVar33;
      iVar30 = iVar30 + iVar14;
      iVar34 = iVar34 + iVar14;
      uVar28 = uVar36;
    } while (lVar33 < (int)uVar2);
    uVar11 = (uint)uVar36;
  }
  if ((int)uVar11 < (int)uVar2) {
    pvVar3 = (this->super_Convolution1D).weight_data.data;
    pvVar4 = (this->weight_data_tm).data;
    sVar5 = (this->weight_data_tm).elemsize;
    sVar6 = (this->weight_data_tm).cstep;
    local_a8 = uVar10 & 0xfffffffc;
    uVar28 = (ulong)uVar11;
    iVar30 = uVar11 * uVar10 * uVar1;
    do {
      uVar19 = (uint)uVar28;
      puVar32 = (undefined4 *)
                ((ulong)((uVar19 & 1) + ((uint)(uVar28 >> 2) & 0x3fffffff) +
                        (uint)((uVar19 >> 1 & 1) != 0)) * sVar5 * sVar6 + (long)pvVar4);
      if ((int)uVar10 < 4) {
        puVar37 = (undefined4 *)((long)pvVar3 + (long)(int)(uVar10 * uVar1 * uVar19) * 4);
        uVar19 = 0;
      }
      else {
        puVar37 = (undefined4 *)((long)pvVar3 + (long)iVar30 * 4);
        iVar14 = 0;
        do {
          if (0 < (int)uVar1) {
            uVar36 = 0;
            puVar29 = puVar37;
            do {
              puVar24 = puVar32;
              lVar12 = 0;
              puVar32 = puVar29;
              do {
                *(undefined4 *)((long)puVar24 + lVar12) = *puVar32;
                lVar12 = lVar12 + 4;
                puVar32 = puVar32 + lVar27;
              } while ((int)lVar12 != 0x10);
              uVar36 = uVar36 + 1;
              puVar29 = puVar29 + 1;
              puVar32 = (undefined4 *)((long)puVar24 + lVar12);
            } while (uVar36 != uVar47);
            puVar32 = (undefined4 *)((long)puVar24 + lVar12);
          }
          puVar37 = puVar37 + (int)(uVar1 * 4);
          iVar34 = iVar14 + 7;
          iVar14 = iVar14 + 4;
          uVar19 = local_a8;
        } while (iVar34 < (int)uVar10);
      }
      if ((int)(uVar19 | 1) < (int)uVar10) {
        puVar29 = puVar37 + lVar27;
        uVar11 = uVar19;
        do {
          if (0 < (int)uVar1) {
            uVar36 = 0;
            do {
              *puVar32 = puVar37[uVar36];
              puVar32[1] = puVar29[uVar36];
              puVar32 = puVar32 + 2;
              uVar36 = uVar36 + 1;
            } while (uVar47 != uVar36);
          }
          puVar37 = puVar37 + (int)(uVar1 * 2);
          uVar19 = uVar11 + 2;
          iVar14 = uVar11 + 3;
          puVar29 = puVar29 + (int)(uVar1 * 2);
          uVar11 = uVar19;
        } while (iVar14 < (int)uVar10);
      }
      if ((int)uVar19 < (int)uVar10) {
        do {
          if (0 < (int)uVar1) {
            lVar12 = 0;
            do {
              *(undefined4 *)((long)puVar32 + lVar12) = *(undefined4 *)((long)puVar37 + lVar12);
              lVar12 = lVar12 + 4;
            } while (uVar47 * 4 - lVar12 != 0);
            puVar32 = (undefined4 *)((long)puVar32 + lVar12);
          }
          uVar19 = uVar19 + 1;
        } while (uVar19 != uVar10);
      }
      uVar28 = uVar28 + 1;
      iVar30 = iVar30 + uVar1 * uVar10;
    } while (uVar28 != uVar2);
  }
  if (opt->lightmode == true) {
    piVar7 = (this->super_Convolution1D).weight_data.refcount;
    if (piVar7 != (int *)0x0) {
      LOCK();
      *piVar7 = *piVar7 + -1;
      UNLOCK();
      if (*piVar7 == 0) {
        pvVar3 = (this->super_Convolution1D).weight_data.data;
        pAVar8 = (this->super_Convolution1D).weight_data.allocator;
        if (pAVar8 == (Allocator *)0x0) {
          if (pvVar3 != (void *)0x0) {
            free(pvVar3);
          }
        }
        else {
          (*pAVar8->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_Convolution1D).weight_data.cstep = 0;
    *(undefined8 *)((long)&(this->super_Convolution1D).weight_data.refcount + 4) = 0;
    *(undefined8 *)((long)&(this->super_Convolution1D).weight_data.elemsize + 4) = 0;
    (this->super_Convolution1D).weight_data.data = (void *)0x0;
    (this->super_Convolution1D).weight_data.refcount = (int *)0x0;
    (this->super_Convolution1D).weight_data.dims = 0;
    (this->super_Convolution1D).weight_data.w = 0;
    (this->super_Convolution1D).weight_data.h = 0;
    (this->super_Convolution1D).weight_data.d = 0;
    (this->super_Convolution1D).weight_data.c = 0;
  }
  return 0;
}

Assistant:

int Convolution1D_x86::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

    int num_input = weight_data_size / kernel_w / num_output;

    convolution1d_transform_kernel_packed(weight_data, weight_data_tm, num_input, num_output, kernel_w);

    if (opt.lightmode)
        weight_data.release();

    return 0;
}